

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O2

long __thiscall bhf::ads::SendRecv(ads *this,string *remote,Frame *f,uint32_t serviceId)

{
  uint uVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined4 in_register_0000000c;
  size_t __n;
  void *__buf;
  long lVar4;
  string local_280;
  AddressList addresses;
  stringstream stream;
  ostream local_240 [376];
  timeval timeout;
  UdpSocket s;
  
  __n = CONCAT44(in_register_0000000c,serviceId);
  _stream = (uint)f;
  Frame::prepend<unsigned_int>((Frame *)remote,(uint *)&stream);
  _stream = 0;
  Frame::prepend<unsigned_int>((Frame *)remote,(uint *)&stream);
  _stream = 0x71146603;
  Frame::prepend<unsigned_int>((Frame *)remote,(uint *)&stream);
  std::__cxx11::string::string((string *)&stream,"48899",(allocator *)&s);
  GetListOfAddresses((ads *)&addresses,(string *)this,(string *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  UdpSocket::UdpSocket
            (&s,addresses._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
                super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
                super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl);
  Socket::write(&s.super_Socket,(int)remote,__buf,__n);
  Frame::reset((Frame *)remote,0x1000);
  timeout.tv_sec = 5;
  timeout.tv_usec = 0;
  Socket::read(&s.super_Socket,(int)remote,&timeout,__n);
  sVar2 = Frame::capacity((Frame *)remote);
  if (sVar2 < 0xc) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_240,"SendRecv");
    poVar3 = std::operator<<(poVar3,"(): frame too short to be AMS response \'0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    Frame::capacity((Frame *)remote);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\'\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    lVar4 = 0x705;
  }
  else {
    uVar1 = Frame::pop<unsigned_int>((Frame *)remote);
    if (uVar1 == 0x71146603) {
      uVar1 = Frame::pop<unsigned_int>((Frame *)remote);
      if (uVar1 == 0) {
        uVar1 = Frame::pop<unsigned_int>((Frame *)remote);
        if (((uint)f | 0x80000000) == uVar1) {
          lVar4 = 0;
          goto LAB_001243a3;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar3 = std::operator<<(local_240,"SendRecv");
        poVar3 = std::operator<<(poVar3,"(): response contains invalid serviceId \'");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,"\'\n");
        std::__cxx11::stringbuf::str();
        Logger::Log(3,&local_280);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar3 = std::operator<<(local_240,"SendRecv");
        poVar3 = std::operator<<(poVar3,"(): response contains invalid invokeId \'");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,"\'\n");
        std::__cxx11::stringbuf::str();
        Logger::Log(3,&local_280);
      }
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      poVar3 = std::operator<<(local_240,"SendRecv");
      poVar3 = std::operator<<(poVar3,"(): response contains invalid cookie \'");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"\'\n");
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_280);
    }
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    lVar4 = 0x706;
  }
LAB_001243a3:
  Socket::~Socket(&s.super_Socket);
  std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::~unique_ptr(&addresses);
  return lVar4;
}

Assistant:

static long SendRecv(const std::string& remote, Frame& f, const uint32_t serviceId)
{
    f.prepend(htole(serviceId));

    static const uint32_t invokeId = 0;
    f.prepend(htole(invokeId));

    static const uint32_t UDP_COOKIE = 0x71146603;
    f.prepend(htole(UDP_COOKIE));

    const auto addresses = GetListOfAddresses(remote, "48899");
    UdpSocket s{addresses.get()};
    s.write(f);
    f.reset();

    static constexpr auto headerLength = sizeof(serviceId) + sizeof(invokeId) + sizeof(UDP_COOKIE);
    timeval timeout { 5, 0 };
    s.read(f, &timeout);
    if (headerLength > f.capacity()) {
        LOG_ERROR(__FUNCTION__ << "(): frame too short to be AMS response '0x" << std::hex << f.capacity() << "'\n");
        return ADSERR_DEVICE_INVALIDSIZE;
    }

    const auto cookie = f.pop_letoh<uint32_t>();
    if (UDP_COOKIE != cookie) {
        LOG_ERROR(__FUNCTION__ << "(): response contains invalid cookie '" << cookie << "'\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    const auto invoke = f.pop_letoh<uint32_t>();
    if (invokeId != invoke) {
        LOG_ERROR(__FUNCTION__ << "(): response contains invalid invokeId '" << invoke << "'\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    const auto service = f.pop_letoh<uint32_t>();
    if ((UdpServiceId::RESPONSE | serviceId) != service) {
        LOG_ERROR(__FUNCTION__ << "(): response contains invalid serviceId '" << std::hex << service << "'\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    return 0;
}